

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

bool __thiscall glslang::TInputScanner::consumeComment(TInputScanner *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  
  lVar2 = (long)this->currentSource;
  if (this->currentSource < this->numSources) {
    sVar4 = this->currentChar;
    do {
      if (sVar4 < this->lengths[lVar2]) {
        if (this->sources[lVar2][sVar4] != '/') goto LAB_0043a13c;
        get(this);
        lVar2 = (long)this->currentSource;
        if (this->numSources <= this->currentSource) {
          this->endOfFileReached = true;
          goto LAB_0043a134;
        }
        uVar3 = this->currentChar;
        goto LAB_0043a11b;
      }
      lVar2 = lVar2 + 1;
      sVar4 = 0;
    } while (this->numSources != lVar2);
    goto LAB_0043a13f;
  }
  this->endOfFileReached = true;
  goto LAB_0043a13c;
LAB_0043a176:
  if (iVar1 == 0x5c) {
    iVar1 = get(this);
    if (iVar1 == 0xd) {
      lVar2 = (long)this->currentSource;
      if (this->currentSource < this->numSources) {
        uVar3 = this->currentChar;
        do {
          if (uVar3 < this->lengths[lVar2]) {
            if (this->sources[lVar2][uVar3] == '\n') {
              get(this);
            }
            break;
          }
          lVar2 = lVar2 + 1;
          uVar3 = 0;
        } while (this->numSources != lVar2);
      }
      else {
        this->endOfFileReached = true;
      }
    }
  }
  else if ((iVar1 + 1U < 0xf) && ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) != 0)) goto LAB_0043a1ee;
  iVar1 = get(this);
  goto LAB_0043a176;
LAB_0043a1ee:
  while ((iVar1 == 10 || (iVar1 == 0xd))) {
    iVar1 = get(this);
  }
  if (iVar1 != -1) {
    unget(this);
  }
  sVar4 = 1;
  goto LAB_0043a13f;
  while( true ) {
    lVar2 = lVar2 + 1;
    uVar3 = 0;
    if (this->numSources == lVar2) break;
LAB_0043a11b:
    if (uVar3 < this->lengths[lVar2]) {
      if (this->sources[lVar2][uVar3] == '*') {
        get(this);
        do {
          iVar1 = get(this);
          while (sVar4 = 1, iVar1 == 0x2a) {
            iVar1 = get(this);
            if (iVar1 == 0x2f) goto LAB_0043a13f;
          }
        } while (iVar1 != -1);
        goto LAB_0043a13f;
      }
      if (this->sources[lVar2][uVar3] == '/') {
        get(this);
        iVar1 = get(this);
        goto LAB_0043a176;
      }
      break;
    }
  }
LAB_0043a134:
  unget(this);
LAB_0043a13c:
  sVar4 = 0;
LAB_0043a13f:
  return SUB81(sVar4,0);
}

Assistant:

bool TInputScanner::consumeComment()
{
    if (peek() != '/')
        return false;

    get();  // consume the '/'
    int c = peek();
    if (c == '/') {

        // a '//' style comment
        get();  // consume the second '/'
        c = get();
        do {
            while (c != EndOfInput && c != '\\' && c != '\r' && c != '\n')
                c = get();

            if (c == EndOfInput || c == '\r' || c == '\n') {
                while (c == '\r' || c == '\n')
                    c = get();

                // we reached the end of the comment
                break;
            } else {
                // it's a '\', so we need to keep going, after skipping what's escaped

                // read the skipped character
                c = get();

                // if it's a two-character newline, skip both characters
                if (c == '\r' && peek() == '\n')
                    get();
                c = get();
            }
        } while (true);

        // put back the last non-comment character
        if (c != EndOfInput)
            unget();

        return true;
    } else if (c == '*') {

        // a '/*' style comment
        get();  // consume the '*'
        c = get();
        do {
            while (c != EndOfInput && c != '*')
                c = get();
            if (c == '*') {
                c = get();
                if (c == '/')
                    break;  // end of comment
                // not end of comment
            } else // end of input
                break;
        } while (true);

        return true;
    } else {
        // it's not a comment, put the '/' back
        unget();

        return false;
    }
}